

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall
PeleLM::diffuse_scalar_fj
          (PeleLM *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *S_old,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Rho_old,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *S_new,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Rho_new,int S_comp,
          int num_comp,int Rho_comp,Real prev_time,Real a_time,Real a_be_cn_theta,MultiFab *rho_mid,
          int rho_flag,MultiFab **fluxn,MultiFab **fluxnp1,int fluxComp,MultiFab *delta_rhs,
          int rhsComp,MultiFab *alpha_in,int alpha_in_comp,MultiFab **betan,MultiFab **betanp1,
          int betaComp,Vector<double,_std::allocator<double>_> *a_visc_coef,int a_visc_coef_comp,
          MultiFab *theVolume,MultiFab **theArea,IntVect *cratio,BCRec *bc,Geometry *theGeom,
          bool add_hoop_stress,bool add_old_time_divFlux,
          Vector<int,_std::allocator<int>_> *diffuse_this_comp)

{
  pointer ppMVar1;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *pVVar2;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *pVVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  MultiFab *pMVar7;
  MultiFab *pMVar8;
  int ntasks;
  int in_stack_fffffffffffff83c;
  int in_stack_fffffffffffff840;
  int iVar9;
  MPI_Comm c;
  string local_7b8;
  int allthere;
  int allnull;
  string local_790;
  Real local_770;
  Real local_768;
  Real local_760;
  int local_758;
  int local_754;
  IntVect local_750;
  undefined1 local_744;
  bool local_743;
  _Vector_base<int,_std::allocator<int>_> local_740;
  bool local_728;
  bool local_727;
  bool local_726;
  bool local_725;
  bool local_724;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_720;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_718;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_710;
  PeleLM *local_708;
  Real local_700;
  Real local_6f8;
  Real local_6f0;
  ForkJoin fj;
  MultiFab S_old_fine;
  MultiFab Rho_new_fine;
  MultiFab Rho_old_fine;
  MultiFab S_new_fine;
  
  iVar9 = *(int *)(amrex::ParallelContext::frames + 0x10);
  iVar4 = num_comp;
  if (iVar9 < num_comp) {
    iVar4 = iVar9;
  }
  ntasks = 1;
  if (1 < (anonymous_namespace)::num_forkjoin_tasks) {
    ntasks = (anonymous_namespace)::num_forkjoin_tasks;
  }
  if (iVar4 < ntasks) {
    ntasks = iVar4;
  }
  if (ntasks == 1) {
    Diffusion::diffuse_scalar
              ((this->super_NavierStokesBase).diffusion,S_old,Rho_old,S_new,Rho_new,S_comp,num_comp,
               Rho_comp,prev_time,a_time,a_be_cn_theta,rho_mid,rho_flag,fluxn,fluxnp1,fluxComp,
               delta_rhs,rhsComp,alpha_in,alpha_in_comp,betan,betanp1,betaComp,cratio,bc,theGeom,
               add_old_time_divFlux,diffuse_this_comp);
    return;
  }
  local_720 = Rho_new;
  local_718 = Rho_old;
  local_710 = S_new;
  local_708 = this;
  local_700 = prev_time;
  local_6f8 = a_time;
  local_6f0 = a_be_cn_theta;
  poVar5 = amrex::OutStream();
  amrex::Print::Print((Print *)&S_old_fine,poVar5);
  poVar5 = (ostream *)
           &S_old_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
            m_bndryReg.m_typ;
  std::operator<<(poVar5,"Diffusion: using ");
  std::ostream::operator<<(poVar5,ntasks);
  std::operator<<(poVar5," fork-join tasks for ");
  std::ostream::operator<<(poVar5,num_comp);
  std::operator<<(poVar5," diffusion calls (on a total of ");
  std::ostream::operator<<(poVar5,iVar9);
  std::operator<<(poVar5," ranks)");
  std::endl<char,std::char_traits<char>>(poVar5);
  amrex::Print::~Print((Print *)&S_old_fine);
  amrex::ForkJoin::ForkJoin(&fj,ntasks);
  fj.flag_verbose = (bool)(anonymous_namespace)::forkjoin_verbose;
  iVar9 = S_comp;
  amrex::MultiFab::MultiFab
            (&S_old_fine,
             *(S_old->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start,make_alias,S_comp,num_comp);
  pVVar3 = local_718;
  pVVar2 = local_720;
  amrex::MultiFab::MultiFab
            (&S_new_fine,
             *(local_710->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start,make_alias,S_comp,num_comp);
  amrex::MultiFab::MultiFab
            (&Rho_old_fine,
             *(pVVar3->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start,make_alias,Rho_comp,1);
  amrex::MultiFab::MultiFab
            (&Rho_new_fine,
             *(pVVar2->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start,make_alias,Rho_comp,1);
  if ((S_old_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0] < 1) ||
     (S_new_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0] < 1)) {
    amrex::Assert_host("S_old_fine.nGrow() >= 1 && S_new_fine.nGrow() >= 1",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                       ,0xbf0,(char *)0x0);
  }
  std::__cxx11::string::string((string *)&local_790,"S_old_fine",(allocator *)&local_7b8);
  amrex::ForkJoin::reg_mf(&fj,&S_old_fine,&local_790,split,in,1);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::string((string *)&local_790,"S_new_fine",(allocator *)&local_7b8);
  amrex::ForkJoin::reg_mf(&fj,&S_new_fine,&local_790,split,inout,1);
  std::__cxx11::string::~string((string *)&local_790);
  if (rho_flag == 2) {
    if ((Rho_old_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0] < 1) ||
       (Rho_new_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0] < 1)) {
      amrex::Assert_host("Rho_old_fine.nGrow() >= 1 && Rho_new_fine.nGrow() >= 1",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                         ,0xbf4,(char *)0x0);
    }
    std::__cxx11::string::string((string *)&local_790,"Rho_old_fine",(allocator *)&local_7b8);
    amrex::ForkJoin::reg_mf(&fj,&Rho_old_fine,&local_790,duplicate,in,1);
    std::__cxx11::string::~string((string *)&local_790);
    std::__cxx11::string::string((string *)&local_790,"Rho_new_fine",(allocator *)&local_7b8);
    amrex::ForkJoin::reg_mf(&fj,&Rho_new_fine,&local_790,duplicate,in,1);
    std::__cxx11::string::~string((string *)&local_790);
  }
  ppMVar1 = (S_old->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = (long)(S_old->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppMVar1;
  if (lVar6 < 9) {
LAB_00274911:
    if (rho_flag != 1) goto LAB_00274961;
    std::__cxx11::string::string((string *)&local_790,"rho_half",(allocator *)&local_7b8);
    amrex::ForkJoin::reg_mf(&fj,rho_mid,&local_790,duplicate,in,-1);
  }
  else {
    pMVar7 = (MultiFab *)operator_new(0x180);
    amrex::MultiFab::MultiFab(pMVar7,ppMVar1[1],make_alias,iVar9,num_comp);
    pMVar8 = (MultiFab *)operator_new(0x180);
    amrex::MultiFab::MultiFab
              (pMVar8,(local_710->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[1],make_alias,iVar9,num_comp);
    if (((pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] < 1) ||
       ((pMVar8->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] < 1)) {
      amrex::Assert_host("S_old_crse->nGrow() >= 1 && S_new_crse->nGrow() >= 1",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                         ,0xbfe,(char *)0x0);
    }
    std::__cxx11::string::string((string *)&local_790,"S_old_crse",(allocator *)&local_7b8);
    amrex::ForkJoin::reg_mf(&fj,pMVar7,&local_790,split,in,1);
    std::__cxx11::string::~string((string *)&local_790);
    std::__cxx11::string::string((string *)&local_790,"S_new_crse",(allocator *)&local_7b8);
    amrex::ForkJoin::reg_mf(&fj,pMVar8,&local_790,split,in,1);
    std::__cxx11::string::~string((string *)&local_790);
    if (rho_flag != 2) goto LAB_00274911;
    pMVar7 = (MultiFab *)operator_new(0x180);
    amrex::MultiFab::MultiFab
              (pMVar7,(local_718->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[1],make_alias,Rho_comp,1);
    pMVar8 = (MultiFab *)operator_new(0x180);
    amrex::MultiFab::MultiFab
              (pMVar8,(local_720->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[1],make_alias,Rho_comp,1);
    if (((pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] < 1) ||
       ((pMVar8->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] < 1)) {
      amrex::Assert_host("Rho_old_crse->nGrow() >= 1 && Rho_new_crse->nGrow() >= 1",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                         ,0xc05,(char *)0x0);
    }
    std::__cxx11::string::string((string *)&local_790,"Rho_old_crse",(allocator *)&local_7b8);
    amrex::ForkJoin::reg_mf(&fj,pMVar7,&local_790,duplicate,in,1);
    std::__cxx11::string::~string((string *)&local_790);
    std::__cxx11::string::string((string *)&local_790,"Rho_new_crse",(allocator *)&local_7b8);
    amrex::ForkJoin::reg_mf(&fj,pMVar8,&local_790,duplicate,in,1);
  }
  std::__cxx11::string::~string((string *)&local_790);
LAB_00274961:
  GetVecOfPtrs((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7b8,fluxn,
               fluxComp,num_comp);
  std::__cxx11::string::string((string *)&local_790,"fluxn",(allocator *)&allnull);
  amrex::ForkJoin::reg_mf_vec
            (&fj,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7b8,
             &local_790,split,inout,-1);
  std::__cxx11::string::~string((string *)&local_790);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7b8);
  GetVecOfPtrs((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7b8,fluxnp1,
               fluxComp,num_comp);
  std::__cxx11::string::string((string *)&local_790,"fluxnp1",(allocator *)&allnull);
  amrex::ForkJoin::reg_mf_vec
            (&fj,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7b8,
             &local_790,split,inout,-1);
  std::__cxx11::string::~string((string *)&local_790);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7b8);
  if (delta_rhs != (MultiFab *)0x0) {
    if ((delta_rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < num_comp + rhsComp
       ) {
      amrex::Assert_host("delta_rhs->nComp() >= rhsComp + num_comp",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                         ,0xc15,(char *)0x0);
    }
    pMVar7 = (MultiFab *)operator_new(0x180);
    amrex::MultiFab::MultiFab(pMVar7,delta_rhs,make_alias,rhsComp,num_comp);
    std::__cxx11::string::string((string *)&local_790,"delta_rhs",(allocator *)&local_7b8);
    amrex::ForkJoin::reg_mf(&fj,pMVar7,&local_790,split,in,-1);
    std::__cxx11::string::~string((string *)&local_790);
  }
  if (alpha_in != (MultiFab *)0x0) {
    if ((alpha_in->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp <
        alpha_in_comp + num_comp) {
      amrex::Assert_host("alpha_in->nComp() >= alpha_in_comp + num_comp",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                         ,0xc1e,(char *)0x0);
    }
    pMVar7 = (MultiFab *)operator_new(0x180);
    amrex::MultiFab::MultiFab(pMVar7,alpha_in,make_alias,alpha_in_comp,num_comp);
    std::__cxx11::string::string((string *)&local_790,"alpha_in",(allocator *)&local_7b8);
    amrex::ForkJoin::reg_mf(&fj,pMVar7,&local_790,split,in,-1);
    std::__cxx11::string::~string((string *)&local_790);
  }
  c = CONCAT31((int3)((uint)iVar9 >> 8),8 < lVar6);
  Diffusion::checkBeta(betan,&allthere,&allnull);
  iVar9 = allthere;
  if (allthere != 0) {
    GetVecOfPtrs((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 &local_7b8,betan,betaComp,num_comp);
    std::__cxx11::string::string((string *)&local_790,"betan",(allocator *)&stack0xfffffffffffff843)
    ;
    amrex::ForkJoin::reg_mf_vec
              (&fj,(Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                   &local_7b8,&local_790,split,in,-1);
    std::__cxx11::string::~string((string *)&local_790);
    std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
    ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *
                  )&local_7b8);
  }
  Diffusion::checkBeta(betanp1,&allthere,&allnull);
  if (allthere != 0) {
    GetVecOfPtrs((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 &local_7b8,betanp1,betaComp,num_comp);
    std::__cxx11::string::string
              ((string *)&local_790,"betanp1",(allocator *)&stack0xfffffffffffff843);
    amrex::ForkJoin::reg_mf_vec
              (&fj,(Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                   &local_7b8,&local_790,split,in,-1);
    std::__cxx11::string::~string((string *)&local_790);
    std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
    ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *
                  )&local_7b8);
  }
  std::__cxx11::string::string((string *)&local_790,"volume",(allocator *)&local_7b8);
  amrex::ForkJoin::reg_mf(&fj,theVolume,&local_790,duplicate,in,-1);
  std::__cxx11::string::~string((string *)&local_790);
  GetVecOfPtrs((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               &local_7b8,theArea,0,1);
  std::__cxx11::string::string((string *)&local_790,"area",(allocator *)&stack0xfffffffffffff843);
  amrex::ForkJoin::reg_mf_vec
            (&fj,(Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 &local_7b8,&local_790,duplicate,in,-1);
  std::__cxx11::string::~string((string *)&local_790);
  std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
  ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                &local_7b8);
  local_790._M_dataplus._M_p = (pointer)bc;
  local_790._M_string_length = (size_type)theGeom;
  local_790.field_2._M_allocated_capacity = (size_type)a_visc_coef;
  local_790.field_2._8_8_ = local_708;
  local_770 = local_700;
  local_768 = local_6f8;
  local_760 = local_6f0;
  local_758 = rho_flag;
  local_754 = a_visc_coef_comp;
  local_750.vect._0_8_ = *(undefined8 *)cratio->vect;
  local_750.vect[2] = cratio->vect[2];
  local_744 = add_hoop_stress;
  local_743 = add_old_time_divFlux;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_740,
             &diffuse_this_comp->super_vector<int,_std::allocator<int>_>);
  local_727 = delta_rhs != (MultiFab *)0x0;
  local_726 = alpha_in != (MultiFab *)0x0;
  local_725 = iVar9 != 0;
  local_724 = allthere != 0;
  local_728 = SUB41(c,0);
  fj.flag_invoked = true;
  amrex::ForkJoin::create_task_output_dir(&fj);
  amrex::ForkJoin::split_tasks(&fj);
  amrex::ForkJoin::copy_data_to_tasks(&fj);
  amrex::ParallelContext::push(c,in_stack_fffffffffffff840,in_stack_fffffffffffff83c);
  amrex::ForkJoin::get_io_filename_abi_cxx11_(&local_7b8,&fj,false);
  amrex::ParallelContext::set_last_frame_ofs(&local_7b8);
  std::__cxx11::string::~string((string *)&local_7b8);
  diffusionFJDriver((PeleLM *)local_790.field_2._8_8_,&fj,local_770,local_768,local_760,local_758,
                    (Vector<double,_std::allocator<double>_> *)
                    local_790.field_2._M_allocated_capacity,local_754,&local_750,
                    (BCRec *)local_790._M_dataplus._M_p,(Geometry *)local_790._M_string_length,false
                    ,local_743,(Vector<int,_std::allocator<int>_> *)&local_740,local_728,local_727,
                    local_726,local_725,local_724);
  amrex::ParallelContext::pop();
  amrex::ForkJoin::copy_data_from_tasks(&fj);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_740);
  amrex::MultiFab::~MultiFab(&Rho_new_fine);
  amrex::MultiFab::~MultiFab(&Rho_old_fine);
  amrex::MultiFab::~MultiFab(&S_new_fine);
  amrex::MultiFab::~MultiFab(&S_old_fine);
  amrex::ForkJoin::~ForkJoin(&fj);
  return;
}

Assistant:

void
PeleLM::diffuse_scalar_fj  (const Vector<MultiFab*>&  S_old,
                            const Vector<MultiFab*>&  Rho_old,
                            Vector<MultiFab*>&        S_new,
                            const Vector<MultiFab*>&  Rho_new,
                            int                       S_comp,
                            int                       num_comp,
                            int                       Rho_comp,
                            Real                      prev_time,
                            Real                      a_time,
                            Real                      a_be_cn_theta,
                            const MultiFab&           rho_mid,
                            int                       rho_flag,
                            MultiFab* const*          fluxn,
                            MultiFab* const*          fluxnp1,
                            int                       fluxComp,
                            MultiFab*                 delta_rhs,
                            int                       rhsComp,
                            const MultiFab*           alpha_in,
                            int                       alpha_in_comp,
                            const MultiFab* const*    betan,
                            const MultiFab* const*    betanp1,
                            int                       betaComp,
                            const Vector<Real>&       a_visc_coef,
                            int                       a_visc_coef_comp,
                            const MultiFab&           theVolume,
                            const MultiFab* const*    theArea,
                            const IntVect&            cratio,
                            const BCRec&              bc,
                            const Geometry&           theGeom,
                            bool                      add_hoop_stress,
                            bool                      add_old_time_divFlux,
                            const amrex::Vector<int>& diffuse_this_comp)
{
  int n_procs = ParallelDescriptor::NProcs();
  int n_tasks_suggest = std::min(num_comp,n_procs);
  int n_tasks = std::min(std::max(1,num_forkjoin_tasks),n_tasks_suggest);

  if (n_tasks == 1)
  {
    diffusion->diffuse_scalar(S_old,Rho_old,S_new,Rho_new,S_comp,num_comp,Rho_comp,
                                  prev_time,a_time,a_be_cn_theta,rho_mid,rho_flag,
                                  fluxn,fluxnp1,fluxComp,delta_rhs,rhsComp,
                                  alpha_in,alpha_in_comp,betan,betanp1,betaComp,
                                  cratio,bc,theGeom,
                                  add_old_time_divFlux,diffuse_this_comp);
  }
  else
  {

    Print() << "Diffusion: using " << n_tasks << " fork-join tasks for "
            << num_comp << " diffusion calls (on a total of " << n_procs << " ranks)" << std::endl;

    ForkJoin fj(n_tasks);
    fj.SetVerbose(forkjoin_verbose);

    MultiFab S_old_fine(*S_old[0], amrex::make_alias, S_comp, num_comp);
    MultiFab S_new_fine(*S_new[0], amrex::make_alias, S_comp, num_comp);
    MultiFab Rho_old_fine(*Rho_old[0], amrex::make_alias, Rho_comp, 1);
    MultiFab Rho_new_fine(*Rho_new[0], amrex::make_alias, Rho_comp, 1);

    const int ng = 1;
    AMREX_ALWAYS_ASSERT(S_old_fine.nGrow() >= 1 && S_new_fine.nGrow() >= 1);
    fj.reg_mf(S_old_fine,  "S_old_fine",  ForkJoin::Strategy::split,    ForkJoin::Intent::in,    ng);
    fj.reg_mf(S_new_fine,  "S_new_fine",  ForkJoin::Strategy::split,    ForkJoin::Intent::inout, ng);
    if (rho_flag == 2) {
      AMREX_ALWAYS_ASSERT(Rho_old_fine.nGrow() >= 1 && Rho_new_fine.nGrow() >= 1);
      fj.reg_mf(Rho_old_fine,"Rho_old_fine",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in, ng);
      fj.reg_mf(Rho_new_fine,"Rho_new_fine",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in, ng);
    }

    bool has_coarse_data = S_old.size() > 1;
    if (has_coarse_data) {
      MultiFab *S_old_crse, *S_new_crse;
      S_old_crse = new MultiFab(*S_old[1], amrex::make_alias, S_comp, num_comp);
      S_new_crse = new MultiFab(*S_new[1], amrex::make_alias, S_comp, num_comp);
      AMREX_ALWAYS_ASSERT(S_old_crse->nGrow() >= 1 && S_new_crse->nGrow() >= 1);
      fj.reg_mf(*S_old_crse,  "S_old_crse",  ForkJoin::Strategy::split,    ForkJoin::Intent::in, ng);
      fj.reg_mf(*S_new_crse,  "S_new_crse",  ForkJoin::Strategy::split,    ForkJoin::Intent::in, ng);
      if (rho_flag == 2) {
        MultiFab *Rho_old_crse, *Rho_new_crse;
        Rho_old_crse = new MultiFab(*Rho_old[1], amrex::make_alias, Rho_comp, 1);
        Rho_new_crse = new MultiFab(*Rho_new[1], amrex::make_alias, Rho_comp, 1);
        AMREX_ALWAYS_ASSERT(Rho_old_crse->nGrow() >= 1 && Rho_new_crse->nGrow() >= 1);
        fj.reg_mf(*Rho_old_crse,"Rho_old_crse",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in, ng);
        fj.reg_mf(*Rho_new_crse,"Rho_new_crse",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in, ng);
      }
    }

    if (rho_flag == 1) {
      fj.reg_mf(rho_mid,"rho_half",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in);
    }

    fj.reg_mf_vec(GetVecOfPtrs(fluxn  ,fluxComp,num_comp),"fluxn",  ForkJoin::Strategy::split,ForkJoin::Intent::inout);
    fj.reg_mf_vec(GetVecOfPtrs(fluxnp1,fluxComp,num_comp),"fluxnp1",ForkJoin::Strategy::split,ForkJoin::Intent::inout);

    bool has_delta_rhs = false;
    if (delta_rhs != 0) {
      MultiFab *Rhs;
      AMREX_ALWAYS_ASSERT(delta_rhs->nComp() >= rhsComp + num_comp);
      Rhs = new MultiFab(*delta_rhs, amrex::make_alias, rhsComp, num_comp);
      fj.reg_mf(*Rhs,"delta_rhs",ForkJoin::Strategy::split,ForkJoin::Intent::in);
      has_delta_rhs = true;
    }

    bool has_alpha_in = false;
    if (alpha_in != 0) {
      MultiFab *Alpha;
      AMREX_ALWAYS_ASSERT(alpha_in->nComp() >= alpha_in_comp + num_comp);
      Alpha = new MultiFab(*alpha_in, amrex::make_alias, alpha_in_comp, num_comp);
      fj.reg_mf(*Alpha,"alpha_in",ForkJoin::Strategy::split,ForkJoin::Intent::in);
      has_alpha_in = true;
    }

    int allnull, allthere;
    Diffusion::checkBeta(betan,   allthere, allnull);
    bool has_betan = false;
    if (allthere) {
      fj.reg_mf_vec(GetVecOfPtrs(betan,  betaComp,num_comp),"betan",  ForkJoin::Strategy::split,ForkJoin::Intent::in);
      has_betan = true;
    }

    Diffusion::checkBeta(betanp1, allthere, allnull);
    bool has_betanp1 = false;
    if (allthere) {
      fj.reg_mf_vec(GetVecOfPtrs(betanp1,betaComp,num_comp),"betanp1",ForkJoin::Strategy::split,ForkJoin::Intent::in);
      has_betanp1 = true;
    }

    fj.reg_mf(theVolume,"volume",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in);
    fj.reg_mf_vec(GetVecOfPtrs(theArea,0,1),"area",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in);

    fj.fork_join(
      [=,&bc,&theGeom,&a_visc_coef] (ForkJoin &f)
      {
        diffusionFJDriver(f,
                          prev_time,
                          a_time,
                          a_be_cn_theta,
                          rho_flag,
                          a_visc_coef,
                          a_visc_coef_comp,
                          cratio,
                          bc,
                          theGeom,
                          add_hoop_stress,
                          add_old_time_divFlux,
                          diffuse_this_comp,
                          has_coarse_data, has_delta_rhs, has_alpha_in, has_betan, has_betanp1);
      }
      );
  }
}